

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

void __thiscall llvm::AppleAcceleratorTable::Entry::Entry(Entry *this,HeaderData *HdrData)

{
  SmallVector<llvm::DWARFFormValue,_3U> *this_00;
  void *pvVar1;
  SmallVectorImpl<llvm::DWARFFormValue> *pSVar2;
  ulong uVar3;
  long lVar4;
  DWARFFormValue local_70;
  Entry *local_40;
  SmallVectorStorage<llvm::DWARFFormValue,_3U> *local_38;
  
  this_00 = &(this->super_Entry).Values;
  local_38 = &(this->super_Entry).Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>;
  (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
       local_38;
  pSVar2 = &(this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>;
  (pSVar2->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
  (pSVar2->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 3;
  (this->super_Entry)._vptr_Entry = (_func_int **)&PTR_getCUOffset_00d8c660;
  this->HdrData = HdrData;
  uVar3 = (ulong)(HdrData->Atoms).
                 super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                 super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
                 super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                 .super_SmallVectorBase.Size;
  local_40 = this;
  if (3 < uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this_00,local_38,uVar3,0x30);
  }
  uVar3 = (ulong)(HdrData->Atoms).
                 super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                 super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
                 super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                 .super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    pvVar1 = (HdrData->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
             super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
             super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
             super_SmallVectorBase.BeginX;
    lVar4 = 0;
    do {
      local_70.Form = *(Form *)((long)pvVar1 + lVar4 + 2);
      local_70.Value.field_0.uval = 0;
      local_70.Value.data = (uint8_t *)0x0;
      local_70.U = (DWARFUnit *)0x0;
      local_70.C = (DWARFContext *)0x0;
      SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)this_00,&local_70);
      lVar4 = lVar4 + 4;
    } while (uVar3 << 2 != lVar4);
  }
  return;
}

Assistant:

AppleAcceleratorTable::Entry::Entry(
    const AppleAcceleratorTable::HeaderData &HdrData)
    : HdrData(&HdrData) {
  Values.reserve(HdrData.Atoms.size());
  for (const auto &Atom : HdrData.Atoms)
    Values.push_back(DWARFFormValue(Atom.second));
}